

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O0

JL_STATUS OutputNumberObject(JlDataObject *NumberObject,JlBuffer *JsonBuffer,
                            JL_OUTPUT_FLAGS OutputFlags,uint32_t StackDepth)

{
  JL_NUM_TYPE JVar1;
  JL_STATUS JVar2;
  size_t DataSize;
  double local_88;
  double numF64;
  int64_t numS64;
  uint64_t numU64;
  char local_68 [4];
  JL_NUM_TYPE numType;
  char numString [64];
  JL_STATUS jlStatus;
  uint32_t StackDepth_local;
  JL_OUTPUT_FLAGS OutputFlags_local;
  JlBuffer *JsonBuffer_local;
  JlDataObject *NumberObject_local;
  
  numString._60_4_ = StackDepth;
  memset(local_68,0,0x40);
  numU64._4_4_ = JlGetObjectNumberType(NumberObject);
  if (numU64._4_4_ == JL_NUM_TYPE_UNSIGNED) {
    numS64 = 0;
    numString._56_4_ = JlGetObjectNumberU64(NumberObject,(uint64_t *)&numS64);
    if (numString._56_4_ == JL_STATUS_SUCCESS) {
      if (((OutputFlags & 0x20) == 0) ||
         (JVar1 = JlIsObjectNumberHex(NumberObject), JVar1 == JL_NUM_TYPE_NONE)) {
        sprintf(local_68,"%lu",numS64);
      }
      else if ((ulong)numS64 < 0x100) {
        sprintf(local_68,"0x%2.2lx",numS64);
      }
      else if ((ulong)numS64 < 0x10000) {
        sprintf(local_68,"0x%4.4lx",numS64);
      }
      else if ((ulong)numS64 < 0x100000000) {
        sprintf(local_68,"0x%8.8lx",numS64);
      }
      else {
        sprintf(local_68,"0x%16.16lx",numS64);
      }
    }
  }
  else if (numU64._4_4_ == JL_NUM_TYPE_SIGNED) {
    numF64 = 0.0;
    numString._56_4_ = JlGetObjectNumberS64(NumberObject,(int64_t *)&numF64);
    if (numString._56_4_ == JL_STATUS_SUCCESS) {
      sprintf(local_68,"%ld",numF64);
    }
  }
  else if (numU64._4_4_ == JL_NUM_TYPE_FLOAT) {
    local_88 = 0.0;
    numString._56_4_ = JlGetObjectNumberF64(NumberObject,&local_88);
    if (numString._56_4_ == JL_STATUS_SUCCESS) {
      sprintf(local_68,"%.16g",local_88);
    }
  }
  else {
    numString[0x38] = -4;
    numString[0x39] = -1;
    numString[0x3a] = -1;
    numString[0x3b] = -1;
  }
  if (numString._56_4_ == 0) {
    DataSize = strlen(local_68);
    numString._56_4_ = JlBufferAdd(JsonBuffer,local_68,DataSize);
  }
  JVar2._0_1_ = numString[0x38];
  JVar2._1_1_ = numString[0x39];
  JVar2._2_1_ = numString[0x3a];
  JVar2._3_1_ = numString[0x3b];
  return JVar2;
}

Assistant:

JL_STATUS
    OutputNumberObject
    (
        JlDataObject const*     NumberObject,
        JlBuffer*               JsonBuffer,
        JL_OUTPUT_FLAGS         OutputFlags,
        uint32_t                StackDepth
    )
{
    JL_STATUS jlStatus;
    char numString [64] = "";

    JL_NUM_TYPE numType = JlGetObjectNumberType( NumberObject );
    if( JL_NUM_TYPE_UNSIGNED == numType )
    {
        uint64_t numU64 = 0;
        jlStatus = JlGetObjectNumberU64( NumberObject, &numU64 );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            if(     OutputFlags & JL_OUTPUT_FLAGS_J5_ALLOW_HEX
                &&  JlIsObjectNumberHex( NumberObject ) )
            {
                // Format hex as 2 digits, 4 digits, 8 digits, or 16 digits depending on value
                if     ( numU64 <= 0xff )       { sprintf( numString, "0x%2.2"PRIx64, numU64 ); }
                else if( numU64 <= 0xffff )     { sprintf( numString, "0x%4.4"PRIx64, numU64 ); }
                else if( numU64 <= 0xffffffff ) { sprintf( numString, "0x%8.8"PRIx64, numU64 ); }
                else                            { sprintf( numString, "0x%16.16"PRIx64, numU64 ); }
            }
            else
            {
                sprintf( numString, "%"PRIu64, numU64 );
            }
        }
    }
    else if( JL_NUM_TYPE_SIGNED == numType )
    {
        int64_t numS64 = 0;
        jlStatus = JlGetObjectNumberS64( NumberObject, &numS64 );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            sprintf( numString, "%"PRId64, numS64 );
        }
    }
    else if( JL_NUM_TYPE_FLOAT == numType )
    {
        // Now try getting as a double
        double numF64 = 0.0;
        jlStatus = JlGetObjectNumberF64( NumberObject, &numF64 );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            // Note: Output is printing using %.16g which gives the best compromise between precision and sensibly
            // printing out most numbers. While %.17g would give full precision it will cause simple numbers such
            // as 2.1 to print as 2.1000000000000001 due to the limitations of the floating point format.
            sprintf( numString, "%.16g", numF64 );
        }
    }
    else
    {
        jlStatus = JL_STATUS_WRONG_TYPE;
    }

    if( JL_STATUS_SUCCESS == jlStatus )
    {
        jlStatus = JlBufferAdd( JsonBuffer, numString, strlen(numString) );
    }

    return jlStatus;
}